

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void __thiscall TinyProcessLib::Process::~Process(Process *this)

{
  Process *this_local;
  
  close_fds(this);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&this->stdin_fd);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&this->stderr_fd);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&this->stdout_fd);
  std::thread::~thread(&this->stdout_stderr_thread);
  std::function<void_(const_char_*,_unsigned_long)>::~function(&this->read_stderr);
  std::function<void_(const_char_*,_unsigned_long)>::~function(&this->read_stdout);
  return;
}

Assistant:

Process::~Process() noexcept {
  close_fds();
}